

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_plamo::llm_build_plamo
          (llm_build_plamo *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  int il_00;
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *up_s;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ggml_tensor *down_s;
  const_reference pvVar9;
  ggml_tensor *pgVar10;
  pointer plVar11;
  ggml_tensor *in_RCX;
  llm_graph_input_attn_kv_unified *in_RDX;
  llm_graph_context *in_RSI;
  long in_RDI;
  ggml_tensor *unaff_retaddr;
  ggml_tensor *in_stack_00000008;
  ggml_tensor *in_stack_00000010;
  ggml_tensor *in_stack_00000018;
  int in_stack_00000020;
  ggml_tensor *inp_out_ids;
  ggml_tensor *sa_out;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *attention_norm;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffdf8;
  int il_01;
  llm_graph_context *in_stack_fffffffffffffe00;
  ggml_tensor *in_stack_fffffffffffffe08;
  ggml_tensor *in_stack_fffffffffffffe10;
  ggml_tensor *in_stack_fffffffffffffe18;
  llm_graph_context *in_stack_fffffffffffffe20;
  ggml_tensor *in_stack_fffffffffffffe50;
  ggml_tensor *in_stack_fffffffffffffe58;
  llm_graph_context *in_stack_fffffffffffffe60;
  ggml_tensor *in_stack_fffffffffffffe78;
  ggml_tensor *in_stack_fffffffffffffea0;
  ggml_tensor *in_stack_fffffffffffffeb0;
  ggml_tensor *in_stack_fffffffffffffeb8;
  ggml_tensor *in_stack_fffffffffffffec0;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  ggml_tensor *in_stack_ffffffffffffff08;
  llm_graph_context *in_stack_ffffffffffffff10;
  ggml_tensor *local_88;
  int local_5c;
  ggml_tensor *local_48;
  float kq_scale;
  ggml_tensor *in_stack_ffffffffffffffc8;
  ggml_tensor *in_stack_ffffffffffffffd0;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffe10,
             (llm_graph_params *)in_stack_fffffffffffffe08);
  pgVar1 = (ggml_tensor *)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x24);
  if (pgVar1 != (ggml_tensor *)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1c6c,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  if (pgVar1 != (ggml_tensor *)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x14)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1c6d,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_rot");
  }
  local_48 = llm_graph_context::build_inp_embd(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  pgVar2 = llm_graph_context::build_inp_pos(in_stack_fffffffffffffe60);
  pgVar3 = (ggml_tensor *)
           llm_graph_context::build_attn_inp_kv_unified
                     ((llm_graph_context *)in_stack_fffffffffffffea0);
  for (local_5c = 0; il_01 = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
      (long)local_5c < *(long *)(in_RDI + 0x28); local_5c = local_5c + 1) {
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x19].ubatch,
               (long)local_5c);
    up_s = llm_graph_context::build_norm
                     (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe08,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                      (int)in_stack_fffffffffffffe00);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,il_01);
    pgVar4 = up_s;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x19].ubatch,
               (long)local_5c);
    kq_scale = (float)((ulong)pgVar4 >> 0x20);
    pgVar4 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,il_01);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x19].ubatch,
               (long)local_5c);
    pgVar5 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,il_01);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x19].ubatch,
               (long)local_5c);
    pgVar6 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,il_01);
    uVar7 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar4,pgVar1,
                            *(undefined8 *)(in_RDI + 0x48),(long)*(int *)(in_RDI + 0xa8));
    uVar8 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar5,pgVar1,
                            *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    pgVar6 = (ggml_tensor *)
             ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar6,pgVar1,
                             *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    il_00 = ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                          *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                          *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                          *(undefined8 *)(in_RDI + 0xc0),uVar7,pgVar2,0,(ulong)pgVar1 & 0xffffffff,
                          *(undefined4 *)(in_RDI + 0xb8));
    down_s = (ggml_tensor *)
             ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                           *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                           *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                           *(undefined8 *)(in_RDI + 0xc0),uVar8,pgVar2,0,(ulong)pgVar1 & 0xffffffff,
                           *(undefined4 *)(in_RDI + 0xb8));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,il_01);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,il_01);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,il_01);
    pgVar4 = pgVar3;
    pgVar5 = in_RCX;
    pvVar9 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x19].ubatch,
                        (long)local_5c);
    type_op = (llm_ffn_op_type)in_RCX;
    type_gate = (llm_ffn_gate_type)pvVar9->wo;
    sqrtf((float)(long)pgVar1);
    local_88 = llm_graph_context::build_attn
                         (in_RSI,in_RDX,(ggml_cgraph *)pgVar5,pgVar1,in_stack_ffffffffffffffd0,
                          in_stack_ffffffffffffffc8,unaff_retaddr,in_stack_00000008,
                          in_stack_00000010,in_stack_00000018,kq_scale,in_stack_00000020);
    in_RCX = pgVar5;
    if ((long)local_5c == *(long *)(in_RDI + 0x28) + -1) {
      pgVar10 = llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffe50)
      ;
      in_stack_fffffffffffffec0 = pgVar10;
      in_stack_fffffffffffffeb8 =
           (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),up_s,pgVar10);
      up_s = in_stack_fffffffffffffeb8;
      local_88 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_88,pgVar10);
      in_stack_fffffffffffffeb0 = local_88;
      local_48 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_48,pgVar10);
      in_RCX = pgVar5;
    }
    pvVar9 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x19].ubatch,
                        (long)local_5c);
    pgVar5 = pvVar9->ffn_up;
    pvVar9 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x19].ubatch,
                        (long)local_5c);
    pgVar10 = pvVar9->ffn_gate;
    pvVar9 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x19].ubatch,
                        (long)local_5c);
    in_stack_fffffffffffffe08 = pvVar9->ffn_down;
    in_stack_fffffffffffffe20 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffe18 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe10 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe00 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffdf8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffea0 =
         llm_graph_context::build_ffn
                   ((llm_graph_context *)in_stack_fffffffffffffea0,
                    (ggml_tensor *)&stack0xfffffffffffffdf8,pgVar10,pgVar5,up_s,
                    in_stack_fffffffffffffe78,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,
                    in_stack_fffffffffffffec0,pgVar6,down_s,pgVar4,type_op,type_gate,il_00);
    pgVar4 = in_stack_fffffffffffffea0;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    in_stack_fffffffffffffe78 =
         (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar4,local_88);
    ggml_add(*(undefined8 *)(in_RDI + 0xc0),in_stack_fffffffffffffe78,local_48);
    local_48 = llm_graph_context::build_cvec(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
  }
  pgVar2 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe08,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                      (int)in_stack_fffffffffffffe00);
  pgVar1 = pgVar2;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             (char *)in_stack_fffffffffffffe00,il_01);
  plVar11 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4d4c9b);
  plVar11->t_embd = pgVar1;
  pgVar2 = llm_graph_context::build_lora_mm
                     ((llm_graph_context *)pgVar2,in_stack_fffffffffffffe58,pgVar1);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             (char *)in_stack_fffffffffffffe00,il_01);
  pgVar1 = pgVar2;
  plVar11 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4d4d20);
  plVar11->t_logits = pgVar2;
  ggml_build_forward_expand(in_RCX,pgVar1);
  return;
}

Assistant:

llm_build_plamo(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            ggml_tensor * attention_norm = cur;

            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_embd_head, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_embd_head, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }
            ggml_tensor * sa_out = cur;

            cur = attention_norm;

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur    = ggml_get_rows(ctx0,    cur, inp_out_ids);
                sa_out = ggml_get_rows(ctx0, sa_out, inp_out_ids);
                inpL   = ggml_get_rows(ctx0,   inpL, inp_out_ids);
            }

            // feed-forward network
            {
                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, sa_out);
            cur = ggml_add(ctx0, cur, inpL);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }